

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

List<Kernel::TermList> ** __thiscall
Lib::Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash>::insert
          (Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash> *this,uint *key,
          List<Kernel::TermList> **val,uint code)

{
  bool bVar1;
  uint *o1;
  List<Kernel::TermList> **ppLVar2;
  uint in_ECX;
  uint *in_RSI;
  Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash> *in_RDI;
  Entry *entry;
  Entry *local_30;
  
  local_30 = firstEntryForCode(in_RDI,in_ECX);
  do {
    bVar1 = Entry::occupied(local_30);
    if (!bVar1) {
      in_RDI->_noOfEntries = in_RDI->_noOfEntries + 1;
      Entry::init(local_30,(EVP_PKEY_CTX *)(ulong)*in_RSI);
      ppLVar2 = Entry::value(local_30);
      return ppLVar2;
    }
    if (local_30->code == in_ECX) {
      o1 = Entry::key(local_30);
      bVar1 = DefaultHash::equals<unsigned_int>(o1,in_RSI);
      if (bVar1) {
        ppLVar2 = Entry::value(local_30);
        return ppLVar2;
      }
    }
    local_30 = nextEntry(in_RDI,local_30);
  } while( true );
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }